

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

char * __thiscall google::protobuf::FieldDescriptor::index(FieldDescriptor *this,char *__s,int __c)

{
  Descriptor *pDVar1;
  FieldDescriptor **ppFVar2;
  
  if ((this->field_0x1 & 8) == 0) {
    ppFVar2 = &this->containing_type_->fields_;
  }
  else {
    pDVar1 = extension_scope(this);
    if (pDVar1 == (Descriptor *)0x0) {
      ppFVar2 = &this->file_->extensions_;
    }
    else {
      pDVar1 = extension_scope(this);
      ppFVar2 = &pDVar1->extensions_;
    }
  }
  return (char *)(((long)this - (long)*ppFVar2) / 0x58);
}

Assistant:

inline int FieldDescriptor::index() const {
  if (!is_extension_) {
    return static_cast<int>(this - containing_type()->fields_);
  } else if (extension_scope() != nullptr) {
    return static_cast<int>(this - extension_scope()->extensions_);
  } else {
    return static_cast<int>(this - file_->extensions_);
  }
}